

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

void __thiscall Fad<float>::Fad(Fad<float> *this,int sz,int i,float *x)

{
  float *pfVar1;
  undefined4 *in_RCX;
  int in_EDX;
  FadSuper *in_RDI;
  float *unaff_retaddr;
  int in_stack_0000000c;
  Vector<float> *in_stack_00000010;
  
  FadSuper::FadSuper(in_RDI);
  *(undefined4 *)in_RDI = *in_RCX;
  Vector<float>::Vector(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  *(undefined4 *)(in_RDI + 0x18) = 0;
  pfVar1 = Vector<float>::operator[]((Vector<float> *)(in_RDI + 8),in_EDX);
  *pfVar1 = 1.0;
  return;
}

Assistant:

Fad(const int sz, const int i, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0))
    {dx_[i]=1.;}